

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_CCtx_params cctxParams;
  
  ZSTD_CCtxParams_init_internal(&cctxParams,&params,0);
  sVar1 = ZSTD_compressBegin_advanced_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&cctxParams,
                     pledgedSrcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_CCtxParams_init_internal(&cctxParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            &cctxParams, pledgedSrcSize);
}